

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status parse_utf16_hex(char *s,uint *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int x4;
  int x3;
  int x2;
  int x1;
  uint *result_local;
  char *s_local;
  
  if ((((*s == '\0') || (s[1] == '\0')) || (s[2] == '\0')) || (s[3] == '\0')) {
    s_local._4_4_ = -1;
  }
  else {
    iVar1 = hex_char_to_int(*s);
    iVar2 = hex_char_to_int(s[1]);
    iVar3 = hex_char_to_int(s[2]);
    uVar4 = hex_char_to_int(s[3]);
    if (((iVar1 == -1) || (iVar2 == -1)) || ((iVar3 == -1 || (uVar4 == 0xffffffff)))) {
      s_local._4_4_ = -1;
    }
    else {
      *result = iVar1 << 0xc | iVar2 << 8 | iVar3 << 4 | uVar4;
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

static JSON_Status parse_utf16_hex(const char *s, unsigned int *result) {
    int x1, x2, x3, x4;
    if (s[0] == '\0' || s[1] == '\0' || s[2] == '\0' || s[3] == '\0') {
        return JSONFailure;
    }
    x1 = hex_char_to_int(s[0]);
    x2 = hex_char_to_int(s[1]);
    x3 = hex_char_to_int(s[2]);
    x4 = hex_char_to_int(s[3]);
    if (x1 == -1 || x2 == -1 || x3 == -1 || x4 == -1) {
        return JSONFailure;
    }
    *result = (unsigned int)((x1 << 12) | (x2 << 8) | (x3 << 4) | x4);
    return JSONSuccess;
}